

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_write_close_unlock(char *file,int *fd,kvtree *hash)

{
  uint __errnum;
  int iVar1;
  ssize_t __length;
  uint *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  if (fd == (int *)0x0) {
    pcVar3 = "Must provide a pointer to an opened file descriptor @ %s:%d";
    uVar4 = 0x66e;
  }
  else if (*fd < 0) {
    pcVar3 = "File descriptor does not point to a valid file @ %s:%d";
    uVar4 = 0x676;
  }
  else if (file == (char *)0x0) {
    pcVar3 = "No filename specified @ %s:%d";
    uVar4 = 0x67e;
  }
  else {
    if (hash != (kvtree *)0x0) {
      lseek(*fd,0,0);
      __length = kvtree_write_fd(file,*fd,hash);
      if ((-1 < __length) && (iVar1 = ftruncate(*fd,__length), iVar1 == -1)) {
        puVar2 = (uint *)__errno_location();
        __errnum = *puVar2;
        pcVar3 = strerror(__errnum);
        kvtree_err("ftruncate() failed: errno=%d (%s) @ %s:%d",(ulong)__errnum,pcVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x696);
      }
      kvtree_close_with_unlock(file,*fd);
      *fd = -1;
      return 0;
    }
    pcVar3 = "No hash provided to write data from @ %s:%d";
    uVar4 = 0x686;
  }
  kvtree_err(pcVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
             ,uVar4);
  return 1;
}

Assistant:

int kvtree_write_close_unlock(const char* file, int* fd, const kvtree* hash)
{
  /* check that we got a pointer to a file descriptor */
  if (fd == NULL) {
    kvtree_err("Must provide a pointer to an opened file descriptor @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that the file descriptor is open */
  if (*fd < 0) {
    kvtree_err("File descriptor does not point to a valid file @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we got a filename */
  if (file == NULL) {
    kvtree_err("No filename specified @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* check that we got a hash to read data into */
  if (hash == NULL) {
    kvtree_err("No hash provided to write data from @ %s:%d",
      __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  if (*fd >= 0) {
    /* wind the file pointer back to the start of the file */
    lseek(*fd, 0, SEEK_SET);

    /* write the updated hash back to the file */
    ssize_t nwrite = kvtree_write_fd(file, *fd, hash);

    /* truncate file to new size */
    if (nwrite >= 0) {
      if (ftruncate(*fd, (off_t) nwrite) == -1) {
        kvtree_err("ftruncate() failed: errno=%d (%s) @ %s:%d",
          errno, strerror(errno), __FILE__, __LINE__
        );
      }
    }

    /* close the file and release the lock */
    kvtree_close_with_unlock(file, *fd);

    /* mark the file descriptor as closed */
    *fd = -1;
  }

  return KVTREE_SUCCESS;
}